

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O3

void lj_cconv_ct_ct(CTState *cts,CType *d,CType *s,uint8_t *dp,uint8_t *sp,CTInfo flags)

{
  double ******ppppppdVar1;
  CType *pCVar2;
  int iVar3;
  float fVar4;
  int64_t i;
  ulong uVar5;
  double *******pppppppdVar6;
  byte bVar7;
  uint uVar8;
  undefined8 unaff_RBX;
  uint uVar9;
  uint uVar10;
  undefined8 unaff_RBP;
  ulong __n;
  undefined8 unaff_R12;
  double *__dest;
  undefined8 unaff_R13;
  undefined8 unaff_R14;
  uint uVar11;
  undefined8 unaff_R15;
  ulong __n_00;
  bool bVar12;
  undefined1 auVar13 [16];
  void *tmpptr;
  double *******local_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  undefined8 uStack_18;
  undefined8 uStack_10;
  undefined8 uStack_8;
  
  uStack_30 = unaff_RBX;
  uStack_8 = unaff_RBP;
  uStack_28 = unaff_R12;
  uStack_20 = unaff_R13;
  uStack_18 = unaff_R14;
  uStack_10 = unaff_R15;
code_r0x001434c7:
  uVar9 = d->info;
  uVar5 = (ulong)uVar9;
  if (0x3fffffff < uVar5) {
switchD_00143555_caseD_3:
    cconv_err_conv(cts,d,s,flags);
  }
  uVar8 = s->info;
  if ((0x3fffffff < uVar8) ||
     (bVar7 = ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar8 >> 0x18) & 0x3c)) & 0xf) +
              ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar9 >> 0x18) & 0x3c)) & 0xf) * '\b',
     0x3f < bVar7)) goto switchD_00143555_caseD_3;
  uVar11 = d->size;
  __n_00 = (ulong)uVar11;
  uVar10 = s->size;
  __n = (ulong)uVar10;
  pppppppdVar6 = (double *******)sp;
  switch(bVar7) {
  case 0:
    if (uVar11 == 1) {
      *dp = *sp;
      return;
    }
    uVar9 = (uint)*sp;
    goto LAB_00143a6b;
  case 1:
    if (uVar10 == 0) {
      bVar12 = false;
    }
    else {
      uVar5 = 0;
      bVar7 = 0;
      do {
        bVar7 = bVar7 | *(byte *)((long)sp + uVar5);
        uVar5 = uVar5 + 1;
      } while (__n != uVar5);
      bVar12 = bVar7 != 0;
    }
    if (uVar11 == 1) {
      *dp = bVar12;
      return;
    }
    uVar9 = (uint)bVar12;
LAB_00143a6b:
    *(uint *)dp = uVar9;
    return;
  case 2:
    if (uVar10 == 4) {
      bVar12 = *(float *)sp != 0.0;
    }
    else {
      if (uVar10 != 8) goto switchD_00143555_caseD_3;
      bVar12 = (double)*(double *******)sp != 0.0;
    }
    if (uVar11 == 1) {
      *dp = -bVar12 & 1U;
      return;
    }
    uVar9 = (uint)(-bVar12 & 1U);
    goto LAB_00143a6b;
  default:
    goto switchD_00143555_caseD_3;
  case 8:
  case 9:
    goto switchD_00143555_caseD_8;
  case 10:
    break;
  case 0xb:
    s = cts->tab + (uVar8 & 0xffff);
    uVar10 = s->size;
    break;
  case 0xd:
    uVar8 = 0x800000;
  case 0x29:
    if ((flags & 1) != 0) {
switchD_00143555_caseD_8:
      uVar9 = (uint)__n;
      if (uVar11 < uVar9 || uVar11 - uVar9 == 0) {
        memcpy(dp,pppppppdVar6,__n_00);
        return;
      }
      if ((uVar8 >> 0x17 & 1) == 0) {
        uVar8 = (uint)(byte)(*(char *)((long)pppppppdVar6 + (ulong)(uVar9 - 1)) >> 7);
      }
      else {
        uVar8 = 0;
      }
      memcpy(dp,pppppppdVar6,__n);
      memset((byte *)((long)dp + __n),uVar8,(ulong)(uVar11 - uVar9));
      return;
    }
    goto switchD_00143555_caseD_3;
  case 0xe:
    if ((flags & 1) != 0) {
      pppppppdVar6 = (double *******)&local_38;
      local_38 = (double *******)sp;
      __n = 8;
      uVar8 = 0x800000;
      goto switchD_00143555_caseD_8;
    }
    goto switchD_00143555_caseD_3;
  case 0x10:
  case 0x11:
    goto switchD_00143555_caseD_10;
  case 0x12:
    goto switchD_00143555_caseD_12;
  case 0x13:
    s = cts->tab + (uVar8 & 0xffff);
    __n = (ulong)s->size;
    goto switchD_00143555_caseD_12;
  case 0x19:
    d = cts->tab + (uVar9 & 0xffff);
    uVar11 = d->size;
    memset((byte *)((long)dp + (ulong)uVar11),0,(ulong)uVar11);
switchD_00143555_caseD_10:
    if (uVar10 < 4) {
      if ((uVar8 >> 0x17 & 1) == 0) {
        if (uVar10 == 2) {
          fVar4 = (float)(int)*(short *)sp;
        }
        else {
          fVar4 = (float)(int)(char)*sp;
        }
      }
      else if (uVar10 == 2) {
        fVar4 = (float)(uint)*(ushort *)sp;
      }
      else {
        fVar4 = (float)(uint)*sp;
      }
LAB_00143a7c:
      ppppppdVar1 = (double ******)(double)(int)fVar4;
    }
    else {
      if ((uVar8 & 0x800000) == 0 && uVar10 == 4) {
        fVar4 = *(float *)sp;
        goto LAB_00143a7c;
      }
      if (uVar10 == 4) {
        ppppppdVar1 = (double ******)(double)(uint)*(float *)sp;
      }
      else {
        if (uVar10 != 8) goto switchD_00143555_caseD_3;
        ppppppdVar1 = *(double *******)sp;
        if ((uVar8 >> 0x17 & 1) == 0) {
          ppppppdVar1 = (double ******)(double)(long)ppppppdVar1;
        }
        else {
          auVar13._8_4_ = (int)((ulong)ppppppdVar1 >> 0x20);
          auVar13._0_8_ = ppppppdVar1;
          auVar13._12_4_ = 0x45300000;
          ppppppdVar1 = (double ******)
                        ((auVar13._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)ppppppdVar1) - 4503599627370496.0));
        }
      }
    }
    if (uVar11 == 4) {
      *(float *)dp = (float)(double)ppppppdVar1;
      return;
    }
    goto LAB_00143a8b;
  case 0x1a:
    d = cts->tab + (uVar9 & 0xffff);
    uVar11 = d->size;
    memset((byte *)((long)dp + (ulong)uVar11),0,(ulong)uVar11);
switchD_00143555_caseD_12:
    uVar9 = (uint)__n;
    if (uVar9 == uVar11) {
LAB_0014394b:
      memcpy(dp,sp,__n);
      return;
    }
    if (uVar9 == 4) {
      ppppppdVar1 = (double ******)(double)*(float *)sp;
    }
    else {
      if (uVar9 != 8) goto switchD_00143555_caseD_3;
      ppppppdVar1 = *(double *******)sp;
    }
    if (uVar11 == 4) {
      *(float *)dp = (float)(double)ppppppdVar1;
      return;
    }
LAB_00143a8b:
    if (uVar11 == 8) {
      *(double *******)dp = ppppppdVar1;
      return;
    }
    goto switchD_00143555_caseD_3;
  case 0x1b:
    __n = __n_00;
    if (uVar11 == uVar10) goto LAB_0014394b;
    d = cts->tab + (uVar5 & 0xffff);
    s = cts->tab + ((ulong)uVar8 & 0xffff);
    lj_cconv_ct_ct(cts,d,s,dp,sp,flags);
    dp = (uint8_t *)((ulong)d->size + (long)dp);
    sp = (uint8_t *)((ulong)s->size + (long)sp);
    goto code_r0x001434c7;
  case 0x21:
  case 0x22:
  case 0x23:
    pCVar2 = cts->tab;
    lj_cconv_ct_ct(cts,pCVar2 + (uVar9 & 0xffff),s,dp,sp,flags);
    uVar9 = pCVar2[uVar9 & 0xffff].size;
    __dest = (double *)dp;
    while (uVar9 < uVar11) {
      __dest = (double *)((long)__dest + (ulong)uVar9);
      memcpy(__dest,dp,(ulong)uVar9);
      uVar11 = (int)__n_00 - uVar9;
      __n_00 = (ulong)uVar11;
    }
    return;
  case 0x24:
    __n = __n_00;
    if (uVar11 == uVar10) goto LAB_0014394b;
    goto switchD_00143555_caseD_3;
  case 0x2a:
    if ((~flags & 3) != 0) goto switchD_00143555_caseD_3;
    uVar5 = (ulong)(uVar11 != 8) << 0x17;
    break;
  case 0x2d:
    iVar3 = lj_cconv_compatptr(cts,d,s,flags);
    if (iVar3 != 0) {
      if (uVar10 == 4) {
        pppppppdVar6 = (double *******)(ulong)(uint)*(float *)sp;
      }
      else {
        pppppppdVar6 = *(double ********)sp;
      }
      if (uVar11 == 4) {
        *(int *)dp = (int)pppppppdVar6;
        return;
      }
      goto LAB_00143ada;
    }
    goto switchD_00143555_caseD_3;
  case 0x2e:
  case 0x2f:
    iVar3 = lj_cconv_compatptr(cts,d,s,flags);
    if (iVar3 != 0) {
      if (uVar11 == 4) {
        *(int *)dp = (int)sp;
        return;
      }
      goto LAB_00143b16;
    }
    goto switchD_00143555_caseD_3;
  case 0x36:
    if ((((flags & 1) == 0) && ((uVar9 >> 0x14 & 1) == 0)) &&
       ((uVar11 != 0xffffffff &&
        ((uVar11 == uVar10 && (iVar3 = lj_cconv_compatptr(cts,d,s,flags), __n = __n_00, iVar3 != 0))
        )))) goto LAB_0014394b;
    goto switchD_00143555_caseD_3;
  case 0x3f:
    if ((((flags & 1) == 0) && (d == s)) && (__n = __n_00, (uVar9 & 0x100000) == 0))
    goto LAB_0014394b;
    goto switchD_00143555_caseD_3;
  }
  if (uVar10 == 4) {
    ppppppdVar1 = (double ******)(double)*(float *)sp;
  }
  else {
    if (uVar10 != 8) goto switchD_00143555_caseD_3;
    ppppppdVar1 = *(double *******)sp;
  }
  if (uVar11 < 4) {
    if (uVar11 == 2) {
      *(short *)dp = (short)(int)(double)ppppppdVar1;
      return;
    }
    *dp = (byte)(int)(double)ppppppdVar1;
    return;
  }
  if ((uVar5 & 0x800000) == 0 && uVar11 == 4) {
    *(int *)dp = (int)(double)ppppppdVar1;
    return;
  }
  if (uVar11 == 4) {
    *(int *)dp = (int)(long)(double)ppppppdVar1;
    return;
  }
  if (uVar11 == 8) {
    pppppppdVar6 = (double *******)(long)(double)ppppppdVar1;
    if (((uint)uVar5 >> 0x17 & 1) != 0) {
      sp = (uint8_t *)(long)((double)ppppppdVar1 + -1.8446744073709552e+19);
      if (-1 < (long)pppppppdVar6) {
        sp = (uint8_t *)pppppppdVar6;
      }
LAB_00143b16:
      *(uint8_t **)dp = sp;
      return;
    }
LAB_00143ada:
    *(double ********)dp = pppppppdVar6;
    return;
  }
  goto switchD_00143555_caseD_3;
}

Assistant:

void lj_cconv_ct_ct(CTState *cts, CType *d, CType *s,
		    uint8_t *dp, uint8_t *sp, CTInfo flags)
{
  CTSize dsize = d->size, ssize = s->size;
  CTInfo dinfo = d->info, sinfo = s->info;
  void *tmpptr;

  lj_assertCTS(!ctype_isenum(dinfo) && !ctype_isenum(sinfo),
	       "unresolved enum");
  lj_assertCTS(!ctype_isattrib(dinfo) && !ctype_isattrib(sinfo),
	       "unstripped attribute");

  if (ctype_type(dinfo) > CT_MAYCONVERT || ctype_type(sinfo) > CT_MAYCONVERT)
    goto err_conv;

  /* Some basic sanity checks. */
  lj_assertCTS(!ctype_isnum(dinfo) || dsize > 0, "bad size for number type");
  lj_assertCTS(!ctype_isnum(sinfo) || ssize > 0, "bad size for number type");
  lj_assertCTS(!ctype_isbool(dinfo) || dsize == 1 || dsize == 4,
	       "bad size for bool type");
  lj_assertCTS(!ctype_isbool(sinfo) || ssize == 1 || ssize == 4,
	       "bad size for bool type");
  lj_assertCTS(!ctype_isinteger(dinfo) || (1u<<lj_fls(dsize)) == dsize,
	       "bad size for integer type");
  lj_assertCTS(!ctype_isinteger(sinfo) || (1u<<lj_fls(ssize)) == ssize,
	       "bad size for integer type");

  switch (cconv_idx2(dinfo, sinfo)) {
  /* Destination is a bool. */
  case CCX(B, B):
    /* Source operand is already normalized. */
    if (dsize == 1) *dp = *sp; else *(int *)dp = *sp;
    break;
  case CCX(B, I): {
    MSize i;
    uint8_t b = 0;
    for (i = 0; i < ssize; i++) b |= sp[i];
    b = (b != 0);
    if (dsize == 1) *dp = b; else *(int *)dp = b;
    break;
    }
  case CCX(B, F): {
    uint8_t b;
    if (ssize == sizeof(double)) b = (*(double *)sp != 0);
    else if (ssize == sizeof(float)) b = (*(float *)sp != 0);
    else goto err_conv;  /* NYI: long double. */
    if (dsize == 1) *dp = b; else *(int *)dp = b;
    break;
    }

  /* Destination is an integer. */
  case CCX(I, B):
  case CCX(I, I):
  conv_I_I:
    if (dsize > ssize) {  /* Zero-extend or sign-extend LSB. */
#if LJ_LE
      uint8_t fill = (!(sinfo & CTF_UNSIGNED) && (sp[ssize-1]&0x80)) ? 0xff : 0;
      memcpy(dp, sp, ssize);
      memset(dp + ssize, fill, dsize-ssize);
#else
      uint8_t fill = (!(sinfo & CTF_UNSIGNED) && (sp[0]&0x80)) ? 0xff : 0;
      memset(dp, fill, dsize-ssize);
      memcpy(dp + (dsize-ssize), sp, ssize);
#endif
    } else {  /* Copy LSB. */
#if LJ_LE
      memcpy(dp, sp, dsize);
#else
      memcpy(dp, sp + (ssize-dsize), dsize);
#endif
    }
    break;
  case CCX(I, F): {
    double n;  /* Always convert via double. */
  conv_I_F:
    /* Convert source to double. */
    if (ssize == sizeof(double)) n = *(double *)sp;
    else if (ssize == sizeof(float)) n = (double)*(float *)sp;
    else goto err_conv;  /* NYI: long double. */
    /* Then convert double to integer. */
    /* The conversion must exactly match the semantics of JIT-compiled code! */
    if (dsize < 4 || (dsize == 4 && !(dinfo & CTF_UNSIGNED))) {
      int32_t i = (int32_t)n;
      if (dsize == 4) *(int32_t *)dp = i;
      else if (dsize == 2) *(int16_t *)dp = (int16_t)i;
      else *(int8_t *)dp = (int8_t)i;
    } else if (dsize == 4) {
      *(uint32_t *)dp = (uint32_t)n;
    } else if (dsize == 8) {
      if (!(dinfo & CTF_UNSIGNED))
	*(int64_t *)dp = (int64_t)n;
      else
	*(uint64_t *)dp = lj_num2u64(n);
    } else {
      goto err_conv;  /* NYI: conversion to >64 bit integers. */
    }
    break;
    }
  case CCX(I, C):
    s = ctype_child(cts, s);
    sinfo = s->info;
    ssize = s->size;
    goto conv_I_F;  /* Just convert re. */
  case CCX(I, P):
    if (!(flags & CCF_CAST)) goto err_conv;
    sinfo = CTINFO(CT_NUM, CTF_UNSIGNED);
    goto conv_I_I;
  case CCX(I, A):
    if (!(flags & CCF_CAST)) goto err_conv;
    sinfo = CTINFO(CT_NUM, CTF_UNSIGNED);
    ssize = CTSIZE_PTR;
    tmpptr = sp;
    sp = (uint8_t *)&tmpptr;
    goto conv_I_I;

  /* Destination is a floating-point number. */
  case CCX(F, B):
  case CCX(F, I): {
    double n;  /* Always convert via double. */
  conv_F_I:
    /* First convert source to double. */
    /* The conversion must exactly match the semantics of JIT-compiled code! */
    if (ssize < 4 || (ssize == 4 && !(sinfo & CTF_UNSIGNED))) {
      int32_t i;
      if (ssize == 4) {
	i = *(int32_t *)sp;
      } else if (!(sinfo & CTF_UNSIGNED)) {
	if (ssize == 2) i = *(int16_t *)sp;
	else i = *(int8_t *)sp;
      } else {
	if (ssize == 2) i = *(uint16_t *)sp;
	else i = *(uint8_t *)sp;
      }
      n = (double)i;
    } else if (ssize == 4) {
      n = (double)*(uint32_t *)sp;
    } else if (ssize == 8) {
      if (!(sinfo & CTF_UNSIGNED)) n = (double)*(int64_t *)sp;
      else n = (double)*(uint64_t *)sp;
    } else {
      goto err_conv;  /* NYI: conversion from >64 bit integers. */
    }
    /* Convert double to destination. */
    if (dsize == sizeof(double)) *(double *)dp = n;
    else if (dsize == sizeof(float)) *(float *)dp = (float)n;
    else goto err_conv;  /* NYI: long double. */
    break;
    }
  case CCX(F, F): {
    double n;  /* Always convert via double. */
  conv_F_F:
    if (ssize == dsize) goto copyval;
    /* Convert source to double. */
    if (ssize == sizeof(double)) n = *(double *)sp;
    else if (ssize == sizeof(float)) n = (double)*(float *)sp;
    else goto err_conv;  /* NYI: long double. */
    /* Convert double to destination. */
    if (dsize == sizeof(double)) *(double *)dp = n;
    else if (dsize == sizeof(float)) *(float *)dp = (float)n;
    else goto err_conv;  /* NYI: long double. */
    break;
    }
  case CCX(F, C):
    s = ctype_child(cts, s);
    sinfo = s->info;
    ssize = s->size;
    goto conv_F_F;  /* Ignore im, and convert from re. */

  /* Destination is a complex number. */
  case CCX(C, I):
    d = ctype_child(cts, d);
    dinfo = d->info;
    dsize = d->size;
    memset(dp + dsize, 0, dsize);  /* Clear im. */
    goto conv_F_I;  /* Convert to re. */
  case CCX(C, F):
    d = ctype_child(cts, d);
    dinfo = d->info;
    dsize = d->size;
    memset(dp + dsize, 0, dsize);  /* Clear im. */
    goto conv_F_F;  /* Convert to re. */

  case CCX(C, C):
    if (dsize != ssize) {  /* Different types: convert re/im separately. */
      CType *dc = ctype_child(cts, d);
      CType *sc = ctype_child(cts, s);
      lj_cconv_ct_ct(cts, dc, sc, dp, sp, flags);
      lj_cconv_ct_ct(cts, dc, sc, dp + dc->size, sp + sc->size, flags);
      return;
    }
    goto copyval;  /* Otherwise this is easy. */

  /* Destination is a vector. */
  case CCX(V, I):
  case CCX(V, F):
  case CCX(V, C): {
    CType *dc = ctype_child(cts, d);
    CTSize esize;
    /* First convert the scalar to the first element. */
    lj_cconv_ct_ct(cts, dc, s, dp, sp, flags);
    /* Then replicate it to the other elements (splat). */
    for (sp = dp, esize = dc->size; dsize > esize; dsize -= esize) {
      dp += esize;
      memcpy(dp, sp, esize);
    }
    break;
    }

  case CCX(V, V):
    /* Copy same-sized vectors, even for different lengths/element-types. */
    if (dsize != ssize) goto err_conv;
    goto copyval;

  /* Destination is a pointer. */
  case CCX(P, I):
    if (!(flags & CCF_CAST)) goto err_conv;
    dinfo = CTINFO(CT_NUM, CTF_UNSIGNED);
    goto conv_I_I;

  case CCX(P, F):
    if (!(flags & CCF_CAST) || !(flags & CCF_FROMTV)) goto err_conv;
    /* The signed conversion is cheaper. x64 really has 47 bit pointers. */
    dinfo = CTINFO(CT_NUM, (LJ_64 && dsize == 8) ? 0 : CTF_UNSIGNED);
    goto conv_I_F;

  case CCX(P, P):
    if (!lj_cconv_compatptr(cts, d, s, flags)) goto err_conv;
    cdata_setptr(dp, dsize, cdata_getptr(sp, ssize));
    break;

  case CCX(P, A):
  case CCX(P, S):
    if (!lj_cconv_compatptr(cts, d, s, flags)) goto err_conv;
    cdata_setptr(dp, dsize, sp);
    break;

  /* Destination is an array. */
  case CCX(A, A):
    if ((flags & CCF_CAST) || (d->info & CTF_VLA) || dsize != ssize ||
	d->size == CTSIZE_INVALID || !lj_cconv_compatptr(cts, d, s, flags))
      goto err_conv;
    goto copyval;

  /* Destination is a struct/union. */
  case CCX(S, S):
    if ((flags & CCF_CAST) || (d->info & CTF_VLA) || d != s)
      goto err_conv;  /* Must be exact same type. */
copyval:  /* Copy value. */
    lj_assertCTS(dsize == ssize, "value copy with different sizes");
    memcpy(dp, sp, dsize);
    break;

  default:
  err_conv:
    cconv_err_conv(cts, d, s, flags);
  }
}